

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
LongsEqualFailure::LongsEqualFailure
          (LongsEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,long expected,
          long actual,SimpleString *text)

{
  SimpleString *in_RDI;
  SimpleString expectedReported;
  SimpleString actualReported;
  SimpleString eDecimal;
  SimpleString aDecimal;
  SimpleString *in_stack_ffffffffffffff00;
  SimpleString *in_stack_ffffffffffffff08;
  SimpleString *in_stack_ffffffffffffff10;
  TestFailure *in_stack_ffffffffffffff18;
  SimpleString *in_stack_ffffffffffffff20;
  SimpleString *in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  char in_stack_ffffffffffffff47;
  TestFailure *in_stack_ffffffffffffff48;
  TestFailure *in_stack_ffffffffffffff50;
  
  TestFailure::TestFailure
            (in_stack_ffffffffffffff50,(UtestShell *)in_stack_ffffffffffffff48,
             (char *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  in_RDI->buffer_ = (char *)&PTR__LongsEqualFailure_001caa98;
  TestFailure::createUserText
            (in_stack_ffffffffffffff48,
             (SimpleString *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  SimpleString::operator=(in_stack_ffffffffffffff00,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x17f3f1);
  StringFrom((long)in_RDI);
  StringFrom((long)in_RDI);
  SimpleString::padStringsToSameLength
            ((SimpleString *)in_stack_ffffffffffffff50,(SimpleString *)in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff47);
  SimpleString::SimpleString(in_stack_ffffffffffffff00,(char *)in_RDI);
  SimpleString::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  BracketsFormattedHexStringFrom((long)in_stack_ffffffffffffff28);
  SimpleString::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  SimpleString::~SimpleString((SimpleString *)0x17f49e);
  SimpleString::~SimpleString((SimpleString *)0x17f4a8);
  SimpleString::~SimpleString((SimpleString *)0x17f4b2);
  SimpleString::SimpleString(in_stack_ffffffffffffff00,(char *)in_RDI);
  SimpleString::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  BracketsFormattedHexStringFrom((long)in_stack_ffffffffffffff28);
  SimpleString::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  SimpleString::~SimpleString((SimpleString *)0x17f512);
  SimpleString::~SimpleString((SimpleString *)0x17f51c);
  SimpleString::~SimpleString((SimpleString *)0x17f526);
  TestFailure::createButWasString
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  SimpleString::operator+=(in_stack_ffffffffffffff00,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x17f561);
  SimpleString::~SimpleString((SimpleString *)0x17f56b);
  SimpleString::~SimpleString((SimpleString *)0x17f578);
  SimpleString::~SimpleString((SimpleString *)0x17f585);
  SimpleString::~SimpleString((SimpleString *)0x17f592);
  return;
}

Assistant:

LongsEqualFailure::LongsEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, long expected, long actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString aDecimal = StringFrom(actual);
    SimpleString eDecimal = StringFrom(expected);

    SimpleString::padStringsToSameLength(aDecimal, eDecimal, ' ');

    SimpleString actualReported = aDecimal + " " + BracketsFormattedHexStringFrom(actual);
    SimpleString expectedReported = eDecimal + " " + BracketsFormattedHexStringFrom(expected);
    message_ += createButWasString(expectedReported, actualReported);
}